

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O2

void __thiscall KrazyMeans::selectRandomCentroids(KrazyMeans *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  element_type *peVar2;
  element_type *peVar3;
  ulong uVar4;
  FeatureVec *vector;
  vector<float,_std::allocator<float>_> *this_00;
  UniformRandomGenerator<long> rg;
  
  UniformRandomGenerator<long>::UniformRandomGenerator(&rg,0);
  pvVar1 = &((this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
             super__Vector_impl_data._M_finish)->values;
  for (this_00 = &((this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                   _M_impl.super__Vector_impl_data._M_start)->values; this_00 != pvVar1;
      this_00 = this_00 + 1) {
    peVar2 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = UniformRandomGenerator<long>::next(&rg);
    peVar3 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::vector<float,_std::allocator<float>_>::operator=
              (this_00,(vector<float,_std::allocator<float>_> *)
                       ((uVar4 % (ulong)(((long)*(pointer *)
                                                 ((long)&(peVar3->vectors).
                                                                                                                  
                                                  super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                         (long)(peVar3->vectors).
                                               super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x18)) *
                        0x18 + (long)(peVar2->vectors).
                                     super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

void KrazyMeans::selectRandomCentroids() {
  UniformRandomGenerator<long> rg;
  // For each cluster centroid, randomly select a feature vector as initialization.
  for (auto &vector : centroids) {
    vector = data_set->vectors[rg.next() % data_set->size()];
  }
}